

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementBeamANCF_3333.cpp
# Opt level: O3

void __thiscall
chrono::fea::ChElementBeamANCF_3333::ComputeMassMatrixAndGravityForce(ChElementBeamANCF_3333 *this)

{
  double *pdVar1;
  double dVar2;
  double zeta;
  double dVar3;
  double dVar4;
  double dVar5;
  double xi;
  element_type *peVar6;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  undefined1 auVar7 [16];
  undefined1 auVar8 [32];
  int iVar9;
  double *pdVar10;
  Index j;
  long lVar11;
  uint uVar12;
  long lVar13;
  ulong uVar14;
  ulong uVar15;
  long lVar16;
  undefined1 *puVar17;
  ulong uVar18;
  ulong uVar19;
  undefined1 auVar20 [32];
  undefined1 auVar21 [64];
  undefined1 auVar22 [64];
  double dVar23;
  VectorN Sxi_compact;
  type tmp;
  ChMatrixNM<double,_NSF,_NSF>_conflict1 MassMatrixCompactSquare;
  double local_608;
  VectorN local_5d8;
  undefined1 local_588 [64];
  double local_500 [64];
  double adStack_300 [9];
  undefined1 local_2b8 [64];
  double local_278 [73];
  
  memset(local_2b8,0,0x288);
  (this->m_GravForceScale).super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
  m_data.array[8] = 0.0;
  (this->m_GravForceScale).super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
  m_data.array[0] = 0.0;
  (this->m_GravForceScale).super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
  m_data.array[1] = 0.0;
  (this->m_GravForceScale).super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
  m_data.array[2] = 0.0;
  (this->m_GravForceScale).super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
  m_data.array[3] = 0.0;
  (this->m_GravForceScale).super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
  m_data.array[4] = 0.0;
  (this->m_GravForceScale).super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
  m_data.array[5] = 0.0;
  (this->m_GravForceScale).super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
  m_data.array[6] = 0.0;
  (this->m_GravForceScale).super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
  m_data.array[7] = 0.0;
  peVar6 = (this->m_material).
           super___shared_ptr<chrono::fea::ChMaterialBeamANCF,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  this_00 = (this->m_material).
            super___shared_ptr<chrono::fea::ChMaterialBeamANCF,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  if (this_00 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    local_608 = peVar6->m_rho;
  }
  else {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_00->_M_use_count = this_00->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_00->_M_use_count = this_00->_M_use_count + 1;
    }
    local_608 = peVar6->m_rho;
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  if (*(long *)(DAT_00b6ab90 + 0x68) != *(long *)(DAT_00b6ab90 + 0x60)) {
    auVar21 = vpmovsxbq_avx512f(ZEXT816(0x302010008));
    auVar22 = vpmovsxbq_avx512f(ZEXT816(0x9080403020100));
    uVar14 = 0;
    auVar20 = vpbroadcastq_avx512vl();
    auVar8 = vpaddq_avx2(auVar20,_DAT_009a7b40);
    auVar7 = vpaddq_avx(auVar20._0_16_,_DAT_009a7bc0);
    auVar21 = vpermi2q_avx512f(auVar21,ZEXT3264(auVar8),ZEXT3264(auVar20));
    auVar21 = vpermi2q_avx512f(auVar22,auVar21,ZEXT1664(auVar7));
    auVar22 = vpbroadcastq_avx512f();
    auVar22._0_56_ = auVar21._0_56_;
    local_588 = vmovdqu64_avx512f(auVar22);
    lVar11 = DAT_00b6ab90;
    do {
      lVar16 = *(long *)(lVar11 + 0x18);
      lVar13 = *(long *)(lVar11 + 0x20);
      if (lVar13 != lVar16) {
        uVar18 = 0;
        do {
          if (lVar13 == lVar16) break;
          uVar19 = 0;
          do {
            dVar2 = *(double *)(lVar16 + uVar18 * 8);
            zeta = *(double *)(lVar16 + uVar19 * 8);
            dVar3 = *(double *)(*(long *)(static_tables_3333 + 0x60) + uVar14 * 8);
            dVar4 = *(double *)(*(long *)(static_tables_3333 + 0x18) + uVar18 * 8);
            dVar5 = *(double *)(*(long *)(static_tables_3333 + 0x18) + uVar19 * 8);
            xi = *(double *)(*(long *)(lVar11 + 0x60) + uVar14 * 8);
            dVar23 = Calc_det_J_0xi(this,xi,dVar2,zeta);
            Calc_Sxi_compact(this,&local_5d8,xi,dVar2,zeta);
            pdVar10 = local_500;
            lVar11 = 0;
            dVar23 = dVar23 * dVar3 * dVar4 * dVar5 * local_608;
            dVar2 = (this->m_GravForceScale).
                    super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
                    array[1];
            (this->m_GravForceScale).super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.
            m_storage.m_data.array[0] =
                 dVar23 * local_5d8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.
                          m_storage.m_data.array[0] +
                 (this->m_GravForceScale).
                 super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.array
                 [0];
            (this->m_GravForceScale).super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.
            m_storage.m_data.array[1] =
                 dVar23 * local_5d8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.
                          m_storage.m_data.array[1] + dVar2;
            dVar2 = (this->m_GravForceScale).
                    super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
                    array[3];
            (this->m_GravForceScale).super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.
            m_storage.m_data.array[2] =
                 dVar23 * local_5d8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.
                          m_storage.m_data.array[2] +
                 (this->m_GravForceScale).
                 super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.array
                 [2];
            (this->m_GravForceScale).super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.
            m_storage.m_data.array[3] =
                 dVar23 * local_5d8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.
                          m_storage.m_data.array[3] + dVar2;
            dVar2 = (this->m_GravForceScale).
                    super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
                    array[5];
            (this->m_GravForceScale).super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.
            m_storage.m_data.array[4] =
                 dVar23 * local_5d8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.
                          m_storage.m_data.array[4] +
                 (this->m_GravForceScale).
                 super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.array
                 [4];
            (this->m_GravForceScale).super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.
            m_storage.m_data.array[5] =
                 dVar23 * local_5d8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.
                          m_storage.m_data.array[5] + dVar2;
            dVar2 = (this->m_GravForceScale).
                    super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
                    array[7];
            (this->m_GravForceScale).super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.
            m_storage.m_data.array[6] =
                 dVar23 * local_5d8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.
                          m_storage.m_data.array[6] +
                 (this->m_GravForceScale).
                 super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.array
                 [6];
            (this->m_GravForceScale).super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.
            m_storage.m_data.array[7] =
                 dVar23 * local_5d8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.
                          m_storage.m_data.array[7] + dVar2;
            (this->m_GravForceScale).super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.
            m_storage.m_data.array[8] =
                 dVar23 * local_5d8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.
                          m_storage.m_data.array[8] +
                 (this->m_GravForceScale).
                 super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.array
                 [8];
            do {
              dVar2 = local_5d8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.
                      m_storage.m_data.array[lVar11];
              lVar11 = lVar11 + 1;
              pdVar10[-8] = dVar23 * local_5d8.
                                     super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.
                                     m_storage.m_data.array[0] * dVar2;
              pdVar10[-7] = dVar23 * local_5d8.
                                     super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.
                                     m_storage.m_data.array[1] * dVar2;
              pdVar10[-6] = dVar23 * local_5d8.
                                     super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.
                                     m_storage.m_data.array[2] * dVar2;
              pdVar10[-5] = dVar23 * local_5d8.
                                     super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.
                                     m_storage.m_data.array[3] * dVar2;
              pdVar10[-4] = dVar23 * local_5d8.
                                     super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.
                                     m_storage.m_data.array[4] * dVar2;
              pdVar10[-3] = dVar23 * local_5d8.
                                     super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.
                                     m_storage.m_data.array[5] * dVar2;
              pdVar10[-2] = dVar23 * local_5d8.
                                     super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.
                                     m_storage.m_data.array[6] * dVar2;
              pdVar10[-1] = dVar23 * local_5d8.
                                     super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.
                                     m_storage.m_data.array[7] * dVar2;
              *pdVar10 = dVar23 * local_5d8.
                                  super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.
                                  m_storage.m_data.array[8] * dVar2;
              pdVar10 = pdVar10 + 9;
            } while (lVar11 != 9);
            auVar21 = vmovdqu64_avx512f(local_588);
            pdVar10 = local_278;
            lVar11 = 0;
            do {
              auVar22 = vpbroadcastq_avx512f();
              auVar22 = vpsllq_avx512f(auVar22,3);
              vpaddq_avx512f(auVar21,auVar22);
              auVar22 = vgatherqpd_avx512f(*pdVar10);
              auVar22 = vaddpd_avx512f(auVar22,*(undefined1 (*) [64])(pdVar10 + -8));
              *(undefined1 (*) [64])(pdVar10 + -8) = auVar22;
              pdVar1 = adStack_300 + lVar11;
              lVar11 = lVar11 + 1;
              *pdVar10 = *pdVar1 + *pdVar10;
              pdVar10 = pdVar10 + 9;
            } while (lVar11 != 9);
            uVar19 = (ulong)((int)uVar19 + 1);
            lVar13 = *(long *)(DAT_00b6ab90 + 0x20);
            lVar16 = *(long *)(DAT_00b6ab90 + 0x18);
            uVar15 = lVar13 - lVar16 >> 3;
            lVar11 = DAT_00b6ab90;
          } while (uVar19 < uVar15);
          uVar18 = (ulong)((int)uVar18 + 1);
        } while (uVar18 < uVar15);
      }
      uVar14 = (ulong)((int)uVar14 + 1);
    } while (uVar14 < (ulong)(*(long *)(lVar11 + 0x68) - *(long *)(lVar11 + 0x60) >> 3));
  }
  iVar9 = 9;
  puVar17 = local_2b8;
  uVar12 = 0;
  lVar11 = 0;
  do {
    uVar14 = (ulong)uVar12;
    lVar13 = 0x2d - uVar14;
    if (0x2d < uVar14) {
      lVar13 = 0;
    }
    lVar16 = 0;
    do {
      if (lVar13 == lVar16) {
        __assert_fail("index >= 0 && index < size()",
                      "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x1ab,
                      "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, 45, 1>, 1>::operator()(Index) [Derived = Eigen::Matrix<double, 45, 1>, Level = 1]"
                     );
      }
      (this->m_MassMatrix).super_PlainObjectBase<Eigen::Matrix<double,_45,_1,_0,_45,_1>_>.m_storage.
      m_data.array[uVar14 + lVar16] = *(double *)(puVar17 + lVar16 * 8);
      lVar16 = lVar16 + 1;
    } while ((int)lVar16 + (int)lVar11 != 9);
    uVar12 = uVar12 + iVar9;
    lVar11 = lVar11 + 1;
    iVar9 = iVar9 + -1;
    puVar17 = puVar17 + 0x50;
  } while (lVar11 != 9);
  return;
}

Assistant:

void ChElementBeamANCF_3333::ComputeMassMatrixAndGravityForce() {
    // For this element, the mass matrix integrand is of order 9 in xi, 3 in eta, and 3 in zeta.
    // 4 GQ Points are needed in the xi direction and 2 GQ Points are needed in the eta and zeta directions for
    // exact integration of the element's mass matrix, even if the reference configuration is not straight. Since the
    // major pieces of the generalized force due to gravity can also be used to calculate the mass matrix, these
    // calculations are performed at the same time.  Only the matrix that scales the acceleration due to gravity is
    // calculated at this time so that any changes to the acceleration due to gravity in the system are correctly
    // accounted for in the generalized internal force calculation.

    ChQuadratureTables* GQTable = GetStaticGQTables();
    unsigned int GQ_idx_xi = 4;        // 5 Point Gauss-Quadrature;
    unsigned int GQ_idx_eta_zeta = 1;  // 2 Point Gauss-Quadrature;

    // Mass Matrix in its compact matrix form.  Since the mass matrix is symmetric, just the upper diagonal entries will
    // be stored.
    ChMatrixNM<double, NSF, NSF> MassMatrixCompactSquare;

    // Set these to zeros since they will be incremented as the vector/matrix is calculated
    MassMatrixCompactSquare.setZero();
    m_GravForceScale.setZero();

    double rho = GetMaterial()->Get_rho();  // Density of the material for the element

    // Sum the contribution to the mass matrix and generalized force due to gravity at the current point
    for (unsigned int it_xi = 0; it_xi < GQTable->Lroots[GQ_idx_xi].size(); it_xi++) {
        for (unsigned int it_eta = 0; it_eta < GQTable->Lroots[GQ_idx_eta_zeta].size(); it_eta++) {
            for (unsigned int it_zeta = 0; it_zeta < GQTable->Lroots[GQ_idx_eta_zeta].size(); it_zeta++) {
                double GQ_weight = GQTable->Weight[GQ_idx_xi][it_xi] * GQTable->Weight[GQ_idx_eta_zeta][it_eta] *
                                   GQTable->Weight[GQ_idx_eta_zeta][it_zeta];
                double xi = GQTable->Lroots[GQ_idx_xi][it_xi];
                double eta = GQTable->Lroots[GQ_idx_eta_zeta][it_eta];
                double zeta = GQTable->Lroots[GQ_idx_eta_zeta][it_zeta];
                double det_J_0xi = Calc_det_J_0xi(xi, eta, zeta);  // determinant of the element Jacobian (volume ratio)

                VectorN Sxi_compact;  // Vector of the Unique Normalized Shape Functions
                Calc_Sxi_compact(Sxi_compact, xi, eta, zeta);

                m_GravForceScale += (GQ_weight * rho * det_J_0xi) * Sxi_compact;
                MassMatrixCompactSquare += (GQ_weight * rho * det_J_0xi) * Sxi_compact * Sxi_compact.transpose();
            }
        }
    }

    // Store just the unique entries in the Mass Matrix in Compact Upper Triangular Form
    // since the full Mass Matrix is both sparse and symmetric
    unsigned int idx = 0;
    for (unsigned int i = 0; i < NSF; i++) {
        for (unsigned int j = i; j < NSF; j++) {
            m_MassMatrix(idx) = MassMatrixCompactSquare(i, j);
            idx++;
        }
    }
}